

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::
join<char_const(&)[46],GLSLstd450_const&,char_const(&)[3],char_const*&,char_const(&)[2],char_const*&,char_const(&)[2],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [46],GLSLstd450 *ts_1,
          char (*ts_2) [3],char **ts_3,char (*ts_4) [2],char **ts_5,char (*ts_6) [2],char **ts_7,
          char (*ts_8) [3],char **ts_9,char (*ts_10) [3])

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> local_1120;
  
  StringStream<4096UL,_4096UL>::StringStream(&local_1120);
  inner::
  join_helper<char_const(&)[46],GLSLstd450_const&,char_const(&)[3],char_const*&,char_const(&)[2],char_const*&,char_const(&)[2],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3]>
            (&local_1120,(char (*) [46])this,(GLSLstd450 *)ts,(char (*) [3])ts_1,(char **)ts_2,
             (char (*) [2])ts_3,(char **)ts_4,(char (*) [2])ts_5,(char **)ts_6,(char (*) [3])ts_7,
             (char **)ts_8,(char (*) [3])ts_9);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&local_1120);
  StringStream<4096UL,_4096UL>::~StringStream(&local_1120);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}